

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86::forward_int8(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _c;
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  size_t sVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  undefined8 *puVar11;
  ulong uVar12;
  Mat *pMVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  undefined8 *puVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  undefined8 *puVar27;
  int iVar28;
  ulong uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  Mat m;
  Option opt_pack1;
  
  m.w = bottom_blob->w;
  m.h = bottom_blob->h;
  iVar8 = bottom_blob->d;
  _c = bottom_blob->c;
  m.elemsize = bottom_blob->elemsize;
  m.elempack = bottom_blob->elempack;
  m.dims = bottom_blob->dims;
  if (m.elempack == 8) {
    switch(m.dims) {
    case 1:
      uVar10 = (this->super_Padding).left;
      if ((((uVar10 & 7) == 0) &&
          (uVar10 = uVar10 + m.w * 8 + (this->super_Padding).right, (uVar10 & 7) == 0)) &&
         ((this->super_Padding).type == 0)) {
        Mat::create(top_blob,(int)uVar10 >> 3,m.elemsize & 0xfffffffffffffff8,8,opt->blob_allocator)
        ;
        if ((Mat *)top_blob->data == (Mat *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          uVar29 = (ulong)(this->super_Padding).value;
          iVar8 = (this->super_Padding).left;
          iVar20 = iVar8 + 7;
          if (-1 < iVar8) {
            iVar20 = iVar8;
          }
          iVar8 = (this->super_Padding).right;
          iVar18 = iVar8 + 7;
          if (-1 < iVar8) {
            iVar18 = iVar8;
          }
          padding_constant_pack8_int8_sse
                    ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0,
                     iVar20 >> 3,iVar18 >> 3,
                     uVar29 << 0x38 | uVar29 << 0x30 | uVar29 << 0x28 |
                     uVar29 << 0x20 | uVar29 << 0x18 | uVar29 << 0x10 | uVar29 << 8 | uVar29);
          return 0;
        }
        return -100;
      }
      break;
    case 2:
      uVar10 = (this->super_Padding).top;
      if ((((uVar10 & 7) == 0) &&
          (uVar10 = uVar10 + m.h * 8 + (this->super_Padding).bottom, (uVar10 & 7) == 0)) &&
         ((this->super_Padding).type == 0)) {
        Mat::create(top_blob,m.w + (this->super_Padding).left + (this->super_Padding).right,
                    (int)uVar10 >> 3,m.elemsize & 0xfffffffffffffff8,8,opt->blob_allocator);
        if ((Mat *)top_blob->data == (Mat *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          uVar29 = (ulong)(this->super_Padding).value;
          iVar8 = (this->super_Padding).top;
          iVar20 = (this->super_Padding).bottom;
          iVar18 = iVar8 + 7;
          if (-1 < iVar8) {
            iVar18 = iVar8;
          }
          iVar8 = iVar20 + 7;
          if (-1 < iVar20) {
            iVar8 = iVar20;
          }
          padding_constant_pack8_int8_sse
                    ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                     iVar18 >> 3,iVar8 >> 3,(this->super_Padding).left,(this->super_Padding).right,
                     uVar29 << 0x38 | uVar29 << 0x30 | uVar29 << 0x28 |
                     uVar29 << 0x20 | uVar29 << 0x18 | uVar29 << 0x10 | uVar29 << 8 | uVar29);
          return 0;
        }
        return -100;
      }
      break;
    case 3:
      uVar10 = (this->super_Padding).front;
      uVar21 = uVar10 + _c * 8 + (this->super_Padding).behind;
      bVar30 = (uVar21 & 7) == 0;
      if (bVar30 && (uVar10 & 7) == 0) {
        if ((uVar21 == _c * 8) || ((this->super_Padding).type == 0)) {
          uVar21 = (int)uVar21 >> 3;
          Mat::create(top_blob,(this->super_Padding).left + m.w + (this->super_Padding).right,
                      (this->super_Padding).top + m.h + (this->super_Padding).bottom,uVar21,
                      (m.elemsize >> 3) << bVar30 * '\x03',8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar8 = (this->super_Padding).front;
            iVar20 = iVar8 + 7;
            if (-1 < iVar8) {
              iVar20 = iVar8;
            }
            if ((int)uVar21 < 1) {
              return 0;
            }
            uVar29 = 0;
            auVar35 = _DAT_00596020;
            uVar10 = -(iVar20 >> 3);
            do {
              pvVar5 = top_blob->data;
              uVar9 = top_blob->elemsize;
              uVar14 = (ulong)(this->super_Padding).value;
              uVar14 = uVar14 << 0x38 | uVar14 << 0x30 | uVar14 << 0x28 |
                       uVar14 << 0x20 | uVar14 << 0x18 | uVar14 << 0x10 | uVar14 << 8 | uVar14;
              uVar7 = -(iVar20 >> 3) + (int)uVar29;
              if ((int)uVar7 < 0 || (int)_c <= (int)uVar7) {
                lVar15 = (long)top_blob->h * (long)top_blob->w;
                iVar8 = (int)((lVar15 * uVar9 + 0xf & 0xfffffffffffffff0) / uVar9);
                if (top_blob->dims == 4) {
                  iVar8 = (int)lVar15;
                }
                uVar7 = iVar8 * top_blob->d;
                if (0 < (int)uVar7) {
                  lVar15 = (ulong)uVar7 - 1;
                  auVar31._8_4_ = (int)lVar15;
                  auVar31._0_8_ = lVar15;
                  auVar31._12_4_ = (int)((ulong)lVar15 >> 0x20);
                  lVar15 = top_blob->cstep * uVar9 * uVar29;
                  auVar31 = auVar31 ^ auVar35;
                  uVar9 = 0;
                  auVar34 = _DAT_0059a360;
                  do {
                    auVar33 = auVar34 ^ auVar35;
                    if ((bool)(~(auVar31._4_4_ < auVar33._4_4_ ||
                                auVar31._0_4_ < auVar33._0_4_ && auVar33._4_4_ == auVar31._4_4_) & 1
                              )) {
                      *(ulong *)((long)pvVar5 + uVar9 * 8 + lVar15) = uVar14;
                    }
                    if (auVar33._12_4_ <= auVar31._12_4_ &&
                        (auVar33._8_4_ <= auVar31._8_4_ || auVar33._12_4_ != auVar31._12_4_)) {
                      *(ulong *)((long)pvVar5 + uVar9 * 8 + lVar15 + 8) = uVar14;
                    }
                    uVar9 = uVar9 + 2;
                    lVar19 = auVar34._8_8_;
                    auVar34._0_8_ = auVar34._0_8_ + 2;
                    auVar34._8_8_ = lVar19 + 2;
                  } while ((uVar7 + 1 & 0xfffffffe) != uVar9);
                }
              }
              else {
                iVar8 = bottom_blob->w;
                lVar15 = (long)iVar8;
                iVar18 = bottom_blob->h;
                pvVar4 = bottom_blob->data;
                uVar12 = bottom_blob->elemsize;
                sVar6 = bottom_blob->cstep;
                puVar27 = (undefined8 *)(uVar7 * sVar6 * uVar12 + (long)pvVar4);
                m.elempack = bottom_blob->elempack;
                m.allocator = bottom_blob->allocator;
                m.refcount = (int *)0x0;
                m.c = bottom_blob->d;
                m.d = 1;
                m.dims = bottom_blob->dims + -1;
                m.cstep = (uVar12 * iVar18 * lVar15 + 0xf & 0xfffffffffffffff0) / uVar12;
                if (bottom_blob->dims == 4) {
                  m.cstep = iVar18 * lVar15;
                }
                pMVar13 = (Mat *)((long)pvVar5 + top_blob->cstep * uVar29 * uVar9);
                iVar16 = (this->super_Padding).type;
                if (iVar16 == 0) {
                  m.data = puVar27;
                  m.elemsize = uVar12;
                  m.w = iVar8;
                  m.h = iVar18;
                  padding_constant_pack8_int8_sse
                            ((ncnn *)&m,pMVar13,(Mat *)(long)top_blob->w,(this->super_Padding).top,
                             (this->super_Padding).bottom,(this->super_Padding).left,
                             (this->super_Padding).right,uVar14);
                  iVar16 = (this->super_Padding).type;
                  auVar35 = _DAT_00596020;
                }
                if (iVar16 == 2) {
                  iVar16 = (this->super_Padding).top;
                  iVar1 = (this->super_Padding).bottom;
                  uVar7 = (this->super_Padding).left;
                  lVar22 = (long)(int)uVar7;
                  uVar9 = (ulong)uVar7;
                  uVar3 = (this->super_Padding).right;
                  uVar14 = (ulong)uVar3;
                  lVar19 = (long)(iVar16 * iVar8);
                  if (iVar16 < 1) {
                    puVar27 = puVar27 + lVar19;
                  }
                  else {
                    lVar25 = sVar6 * uVar12 * (ulong)uVar10;
                    lVar26 = lVar25 + lVar22 * 8 + lVar19 * 8 + (long)pvVar4;
                    puVar27 = (undefined8 *)(lVar25 + lVar19 * 8 + (long)pvVar4);
                    iVar28 = 0;
                    do {
                      if (0 < (int)uVar7) {
                        lVar19 = 0;
                        do {
                          pMVar13->data = *(void **)(lVar26 + lVar19 * 8);
                          pMVar13 = (Mat *)&pMVar13->refcount;
                          lVar19 = lVar19 + -1;
                        } while (-lVar19 != uVar9);
                      }
                      puVar11 = puVar27;
                      if (0 < iVar8) {
                        lVar19 = 0;
                        lVar25 = 0;
                        do {
                          (&pMVar13->data)[lVar25] = (void *)puVar27[lVar25];
                          lVar25 = lVar25 + 1;
                          lVar19 = lVar19 + -8;
                        } while (iVar8 != (int)lVar25);
                        pMVar13 = (Mat *)((long)pMVar13 - lVar19);
                        puVar11 = (undefined8 *)((long)puVar27 - lVar19);
                      }
                      if (0 < (int)uVar3) {
                        lVar19 = 0;
                        do {
                          pMVar13->data = (void *)puVar11[lVar19 + -2];
                          pMVar13 = (Mat *)&pMVar13->refcount;
                          lVar19 = lVar19 + -1;
                        } while (-lVar19 != uVar14);
                      }
                      puVar27 = puVar27 + -lVar15;
                      iVar28 = iVar28 + 1;
                      lVar26 = lVar26 + lVar15 * -8;
                    } while (iVar28 != iVar16);
                  }
                  if (0 < iVar18) {
                    iVar16 = 0;
                    do {
                      if (0 < (int)uVar7) {
                        lVar19 = 0;
                        do {
                          pMVar13->data = (void *)puVar27[lVar22 + lVar19];
                          pMVar13 = (Mat *)&pMVar13->refcount;
                          lVar19 = lVar19 + -1;
                        } while (-lVar19 != uVar9);
                      }
                      if (0 < iVar8) {
                        lVar19 = 0;
                        lVar25 = 0;
                        do {
                          (&pMVar13->data)[lVar25] = (void *)puVar27[lVar25];
                          lVar25 = lVar25 + 1;
                          lVar19 = lVar19 + -8;
                        } while (iVar8 != (int)lVar25);
                        pMVar13 = (Mat *)((long)pMVar13 - lVar19);
                        puVar27 = (undefined8 *)((long)puVar27 - lVar19);
                      }
                      if (0 < (int)uVar3) {
                        lVar19 = 0;
                        do {
                          pMVar13->data = (void *)puVar27[lVar19 + -2];
                          pMVar13 = (Mat *)&pMVar13->refcount;
                          lVar19 = lVar19 + -1;
                        } while (-lVar19 != uVar14);
                      }
                      iVar16 = iVar16 + 1;
                    } while (iVar16 != iVar18);
                  }
                  if (0 < iVar1) {
                    puVar11 = puVar27 + -(long)(iVar8 * 2);
                    puVar27 = puVar27 + (lVar22 - iVar8 * 2);
                    iVar18 = 0;
                    do {
                      if (0 < (int)uVar7) {
                        lVar19 = 0;
                        do {
                          pMVar13->data = (void *)puVar27[lVar19];
                          pMVar13 = (Mat *)&pMVar13->refcount;
                          lVar19 = lVar19 + -1;
                        } while (-lVar19 != uVar9);
                      }
                      puVar23 = puVar11;
                      if (0 < iVar8) {
                        lVar22 = 0;
                        lVar19 = 0;
                        do {
                          (&pMVar13->data)[lVar19] = (void *)puVar11[lVar19];
                          lVar19 = lVar19 + 1;
                          lVar22 = lVar22 + -8;
                        } while (iVar8 != (int)lVar19);
                        pMVar13 = (Mat *)((long)pMVar13 - lVar22);
                        puVar23 = (undefined8 *)((long)puVar11 - lVar22);
                      }
                      if (0 < (int)uVar3) {
                        lVar19 = 0;
                        do {
                          pMVar13->data = (void *)puVar23[lVar19 + -2];
                          pMVar13 = (Mat *)&pMVar13->refcount;
                          lVar19 = lVar19 + -1;
                        } while (-lVar19 != uVar14);
                      }
                      puVar11 = puVar11 + -lVar15;
                      iVar18 = iVar18 + 1;
                      puVar27 = puVar27 + -lVar15;
                    } while (iVar18 != iVar1);
                  }
                }
                else if (iVar16 == 1) {
                  iVar16 = (this->super_Padding).top;
                  iVar1 = (this->super_Padding).bottom;
                  iVar28 = (this->super_Padding).left;
                  iVar2 = (this->super_Padding).right;
                  if (0 < iVar16) {
                    lVar19 = sVar6 * uVar12 * (ulong)uVar10;
                    iVar17 = 0;
                    do {
                      if (0 < iVar28) {
                        pvVar5 = (void *)*puVar27;
                        iVar24 = iVar28;
                        do {
                          pMVar13->data = pvVar5;
                          pMVar13 = (Mat *)&pMVar13->refcount;
                          iVar24 = iVar24 + -1;
                        } while (iVar24 != 0);
                      }
                      puVar11 = puVar27;
                      if (0 < iVar8) {
                        lVar22 = 0;
                        lVar25 = 0;
                        do {
                          (&pMVar13->data)[lVar25] = *(void **)((long)pvVar4 + lVar25 * 8 + lVar19);
                          lVar25 = lVar25 + 1;
                          lVar22 = lVar22 + -8;
                        } while (iVar8 != (int)lVar25);
                        pMVar13 = (Mat *)((long)pMVar13 - lVar22);
                        puVar11 = (undefined8 *)((long)pvVar4 + (lVar19 - lVar22));
                      }
                      if (0 < iVar2) {
                        pvVar5 = (void *)puVar11[-1];
                        iVar24 = iVar2;
                        do {
                          pMVar13->data = pvVar5;
                          pMVar13 = (Mat *)&pMVar13->refcount;
                          iVar24 = iVar24 + -1;
                        } while (iVar24 != 0);
                      }
                      iVar17 = iVar17 + 1;
                    } while (iVar17 != iVar16);
                  }
                  if (0 < iVar18) {
                    iVar16 = 0;
                    do {
                      if (0 < iVar28) {
                        pvVar5 = (void *)*puVar27;
                        iVar17 = iVar28;
                        do {
                          pMVar13->data = pvVar5;
                          pMVar13 = (Mat *)&pMVar13->refcount;
                          iVar17 = iVar17 + -1;
                        } while (iVar17 != 0);
                      }
                      if (0 < iVar8) {
                        lVar19 = 0;
                        lVar22 = 0;
                        do {
                          (&pMVar13->data)[lVar22] = (void *)puVar27[lVar22];
                          lVar22 = lVar22 + 1;
                          lVar19 = lVar19 + -8;
                        } while (iVar8 != (int)lVar22);
                        pMVar13 = (Mat *)((long)pMVar13 - lVar19);
                        puVar27 = (undefined8 *)((long)puVar27 - lVar19);
                      }
                      if (0 < iVar2) {
                        pvVar5 = (void *)puVar27[-1];
                        iVar17 = iVar2;
                        do {
                          pMVar13->data = pvVar5;
                          pMVar13 = (Mat *)&pMVar13->refcount;
                          iVar17 = iVar17 + -1;
                        } while (iVar17 != 0);
                      }
                      iVar16 = iVar16 + 1;
                    } while (iVar16 != iVar18);
                  }
                  if (0 < iVar1) {
                    puVar27 = puVar27 + -lVar15;
                    iVar18 = 0;
                    do {
                      if (0 < iVar28) {
                        pvVar5 = (void *)*puVar27;
                        iVar16 = iVar28;
                        do {
                          pMVar13->data = pvVar5;
                          pMVar13 = (Mat *)&pMVar13->refcount;
                          iVar16 = iVar16 + -1;
                        } while (iVar16 != 0);
                      }
                      puVar11 = puVar27;
                      if (0 < iVar8) {
                        lVar15 = 0;
                        lVar19 = 0;
                        do {
                          (&pMVar13->data)[lVar19] = (void *)puVar27[lVar19];
                          lVar19 = lVar19 + 1;
                          lVar15 = lVar15 + -8;
                        } while (iVar8 != (int)lVar19);
                        pMVar13 = (Mat *)((long)pMVar13 - lVar15);
                        puVar11 = (undefined8 *)((long)puVar27 - lVar15);
                      }
                      if (0 < iVar2) {
                        pvVar5 = (void *)puVar11[-1];
                        iVar16 = iVar2;
                        do {
                          pMVar13->data = pvVar5;
                          pMVar13 = (Mat *)&pMVar13->refcount;
                          iVar16 = iVar16 + -1;
                        } while (iVar16 != 0);
                      }
                      iVar18 = iVar18 + 1;
                    } while (iVar18 != iVar1);
                  }
                }
              }
              uVar29 = uVar29 + 1;
              uVar10 = uVar10 + 1;
            } while (uVar29 != uVar21);
            return 0;
          }
          return -100;
        }
      }
      break;
    case 4:
      if ((this->super_Padding).type == 0) {
        uVar10 = (this->super_Padding).front + iVar8 + (this->super_Padding).behind;
        Mat::create(top_blob,m.w + (this->super_Padding).left + (this->super_Padding).right,
                    m.h + (this->super_Padding).top + (this->super_Padding).bottom,uVar10,_c,
                    m.elemsize,8,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          if ((int)_c < 1) {
            return 0;
          }
          uVar29 = 0;
          auVar35 = _DAT_00596020;
          do {
            if (0 < (int)uVar10) {
              uVar9 = (ulong)(this->super_Padding).value;
              uVar9 = uVar9 << 0x38 | uVar9 << 0x30 | uVar9 << 0x28 |
                      uVar9 << 0x20 | uVar9 << 0x18 | uVar9 << 0x10 | uVar9 << 8 | uVar9;
              uVar14 = 0;
              do {
                pMVar13 = (Mat *)(long)top_blob->w;
                pvVar5 = top_blob->data;
                sVar6 = top_blob->elemsize;
                lVar19 = top_blob->cstep * uVar29;
                lVar15 = (long)top_blob->h * (long)pMVar13;
                uVar21 = (int)uVar14 - (this->super_Padding).front;
                if ((int)uVar21 < 0 || iVar8 <= (int)uVar21) {
                  uVar21 = (uint)lVar15;
                  if (0 < (int)uVar21) {
                    lVar15 = (ulong)(uVar21 & 0x7fffffff) - 1;
                    auVar32._8_4_ = (int)lVar15;
                    auVar32._0_8_ = lVar15;
                    auVar32._12_4_ = (int)((ulong)lVar15 >> 0x20);
                    lVar15 = sVar6 * ((long)top_blob->h * uVar14 * (long)pMVar13 + lVar19);
                    auVar32 = auVar32 ^ auVar35;
                    uVar12 = 0;
                    auVar33 = _DAT_0059a360;
                    do {
                      auVar34 = auVar33 ^ auVar35;
                      if ((bool)(~(auVar32._4_4_ < auVar34._4_4_ ||
                                  auVar32._0_4_ < auVar34._0_4_ && auVar34._4_4_ == auVar32._4_4_) &
                                1)) {
                        *(ulong *)((long)pvVar5 + uVar12 * 8 + lVar15) = uVar9;
                      }
                      if (auVar34._12_4_ <= auVar32._12_4_ &&
                          (auVar34._8_4_ <= auVar32._8_4_ || auVar34._12_4_ != auVar32._12_4_)) {
                        *(ulong *)((long)pvVar5 + uVar12 * 8 + lVar15 + 8) = uVar9;
                      }
                      uVar12 = uVar12 + 2;
                      lVar19 = auVar33._8_8_;
                      auVar33._0_8_ = auVar33._0_8_ + 2;
                      auVar33._8_8_ = lVar19 + 2;
                    } while ((uVar21 + 1 & 0xfffffffe) != uVar12);
                  }
                }
                else {
                  m.w = bottom_blob->w;
                  m.h = bottom_blob->h;
                  m.elemsize = bottom_blob->elemsize;
                  m.elempack = bottom_blob->elempack;
                  m.allocator = bottom_blob->allocator;
                  m.cstep = (long)m.h * (long)m.w;
                  m.data = (void *)((long)bottom_blob->data +
                                   uVar21 * m.elemsize * m.cstep +
                                   bottom_blob->cstep * uVar29 * m.elemsize);
                  m.refcount = (int *)0x0;
                  m.dims = 2;
                  m.d = 1;
                  m.c = 1;
                  padding_constant_pack8_int8_sse
                            ((ncnn *)&m,
                             (Mat *)((long)pvVar5 + lVar15 * sVar6 * uVar14 + lVar19 * sVar6),
                             pMVar13,(this->super_Padding).top,(this->super_Padding).bottom,
                             (this->super_Padding).left,(this->super_Padding).right,uVar9);
                  auVar35 = _DAT_00596020;
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar10);
            }
            uVar29 = uVar29 + 1;
          } while (uVar29 != _c);
          return 0;
        }
        return -100;
      }
    }
  }
  m.data = bottom_blob->data;
  m.refcount = bottom_blob->refcount;
  m.allocator = bottom_blob->allocator;
  m.cstep = bottom_blob->cstep;
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + 1;
    UNLOCK();
  }
  m.d = iVar8;
  m.c = _c;
  if (m.elempack != 1) {
    opt_pack1.lightmode = opt->lightmode;
    opt_pack1.use_shader_pack8 = opt->use_shader_pack8;
    opt_pack1.use_subgroup_ops = opt->use_subgroup_ops;
    opt_pack1.use_reserved_0 = opt->use_reserved_0;
    opt_pack1.num_threads = opt->num_threads;
    opt_pack1.workspace_allocator = opt->workspace_allocator;
    opt_pack1.openmp_blocktime = opt->openmp_blocktime;
    opt_pack1.use_winograd_convolution = opt->use_winograd_convolution;
    opt_pack1.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_pack1.use_int8_inference = opt->use_int8_inference;
    opt_pack1.use_vulkan_compute = opt->use_vulkan_compute;
    opt_pack1.use_bf16_storage = opt->use_bf16_storage;
    opt_pack1.use_fp16_packed = opt->use_fp16_packed;
    opt_pack1.use_fp16_storage = opt->use_fp16_storage;
    opt_pack1.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_pack1.use_int8_packed = opt->use_int8_packed;
    opt_pack1.use_int8_storage = opt->use_int8_storage;
    opt_pack1.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_pack1.use_packing_layout = opt->use_packing_layout;
    opt_pack1.vulkan_device_index = opt->vulkan_device_index;
    opt_pack1.use_reserved_1 = opt->use_reserved_1;
    opt_pack1.use_image_storage = opt->use_image_storage;
    opt_pack1.use_tensor_storage = opt->use_tensor_storage;
    opt_pack1.use_reserved_2 = opt->use_reserved_2;
    opt_pack1.flush_denormals = opt->flush_denormals;
    opt_pack1.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_pack1.use_shader_local_memory = opt->use_shader_local_memory;
    opt_pack1.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_pack1.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_pack1.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_pack1.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_pack1.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_pack1.use_fp16_uniform = opt->use_fp16_uniform;
    opt_pack1.use_int8_uniform = opt->use_int8_uniform;
    opt_pack1.use_reserved_9 = opt->use_reserved_9;
    opt_pack1.use_reserved_10 = opt->use_reserved_10;
    opt_pack1.use_reserved_11 = opt->use_reserved_11;
    opt_pack1.blob_allocator = opt->workspace_allocator;
    convert_packing(bottom_blob,&m,1,&opt_pack1);
    if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
      iVar8 = -100;
      goto LAB_003f8713;
    }
  }
  iVar8 = Padding::forward(&this->super_Padding,&m,top_blob,opt);
LAB_003f8713:
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + -1;
    UNLOCK();
    if (*m.refcount == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (**(code **)(*(long *)m.allocator + 0x18))();
      }
    }
  }
  return iVar8;
}

Assistant:

int Padding_x86::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}